

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

bool ON_Font::EqualFontFamily(ON_Font *lhs,ON_Font *rhs)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ON_wString *pOVar4;
  ON_wString *pOVar5;
  ON_wString *pOVar6;
  ON_wString local_60;
  ON_wString local_58;
  ON_wString local_50;
  ON_wString local_48;
  ON_wString local_40;
  ON_wString *local_38;
  
  if (rhs == (ON_Font *)0x0 || lhs == (ON_Font *)0x0) {
    return false;
  }
  if (lhs == rhs) {
    return true;
  }
  pOVar5 = &rhs->m_en_family_name;
  bVar2 = Internal_EqualName(&lhs->m_en_family_name,pOVar5);
  if (bVar2) {
    return true;
  }
  bVar2 = ON_wString::IsNotEmpty(&lhs->m_loc_family_name);
  pOVar6 = &lhs->m_en_family_name;
  if (bVar2) {
    pOVar6 = &lhs->m_loc_family_name;
  }
  ON_wString::ON_wString(&local_60,pOVar6);
  pOVar6 = &rhs->m_loc_family_name;
  bVar2 = ON_wString::IsNotEmpty(pOVar6);
  pOVar4 = pOVar5;
  if (bVar2) {
    pOVar4 = pOVar6;
  }
  ON_wString::ON_wString(&local_58,pOVar4);
  bVar2 = Internal_EqualName(&local_60,&local_58);
  ON_wString::~ON_wString(&local_58);
  ON_wString::~ON_wString(&local_60);
  if (bVar2) {
    return true;
  }
  bVar2 = ON_wString::IsNotEmpty(&lhs->m_loc_face_name);
  pOVar4 = &lhs->m_en_face_name;
  if (bVar2) {
    pOVar4 = &lhs->m_loc_face_name;
  }
  ON_wString::ON_wString(&local_60,pOVar4);
  bVar2 = ON_wString::IsNotEmpty(&local_60);
  if (bVar2) {
    bVar3 = ON_wString::IsNotEmpty(pOVar6);
    if (bVar3) {
      pOVar5 = pOVar6;
    }
    ON_wString::ON_wString(&local_58,pOVar5);
    bVar3 = ON_wString::IsNotEmpty(&local_58);
  }
  else {
    bVar3 = false;
  }
  if (bVar2) {
    ON_wString::~ON_wString(&local_58);
  }
  ON_wString::~ON_wString(&local_60);
  if (bVar3 != false) {
    return false;
  }
  bVar2 = Internal_EqualName(&lhs->m_en_postscript_name,&rhs->m_en_postscript_name);
  bVar3 = true;
  if (!bVar2) {
    local_38 = &rhs->m_en_windows_logfont_name;
    bVar2 = Internal_EqualName(&lhs->m_en_windows_logfont_name,local_38);
    if (!bVar2) {
      bVar2 = ON_wString::IsNotEmpty(&lhs->m_loc_postscript_name);
      pOVar5 = &lhs->m_en_postscript_name;
      if (bVar2) {
        pOVar5 = &lhs->m_loc_postscript_name;
      }
      ON_wString::ON_wString(&local_60,pOVar5);
      bVar2 = ON_wString::IsNotEmpty(&rhs->m_loc_postscript_name);
      pOVar5 = &rhs->m_en_postscript_name;
      if (bVar2) {
        pOVar5 = &rhs->m_loc_postscript_name;
      }
      ON_wString::ON_wString(&local_40,pOVar5);
      bVar2 = Internal_EqualName(&local_60,&local_40);
      if (bVar2) {
        bVar1 = true;
        bVar2 = false;
        bVar3 = true;
      }
      else {
        bVar2 = ON_wString::IsNotEmpty(&lhs->m_loc_windows_logfont_name);
        pOVar5 = &lhs->m_en_windows_logfont_name;
        if (bVar2) {
          pOVar5 = &lhs->m_loc_windows_logfont_name;
        }
        ON_wString::ON_wString(&local_48,pOVar5);
        bVar2 = ON_wString::IsNotEmpty(&rhs->m_loc_windows_logfont_name);
        pOVar5 = local_38;
        if (bVar2) {
          pOVar5 = &rhs->m_loc_windows_logfont_name;
        }
        ON_wString::ON_wString(&local_50,pOVar5);
        bVar3 = Internal_EqualName(&local_48,&local_50);
        bVar1 = true;
        bVar2 = true;
      }
      goto LAB_00484cca;
    }
  }
  bVar1 = false;
  bVar2 = false;
LAB_00484cca:
  if (bVar2) {
    ON_wString::~ON_wString(&local_50);
    ON_wString::~ON_wString(&local_48);
  }
  if (bVar1) {
    ON_wString::~ON_wString(&local_40);
    ON_wString::~ON_wString(&local_60);
  }
  return bVar3;
}

Assistant:

bool ON_Font::EqualFontFamily(
  const ON_Font* lhs,
  const ON_Font* rhs
)
{
  if (nullptr == lhs || nullptr == rhs)
    return false;
  if (lhs == rhs)
    return true;

  if (Internal_EqualName(lhs->m_en_family_name, rhs->m_en_family_name))
    return true;
  if (Internal_EqualName(lhs->FamilyName(ON_Font::NameLocale::LocalizedFirst), rhs->FamilyName(ON_Font::NameLocale::LocalizedFirst)))
    return true;
  if (lhs->FaceName().IsNotEmpty() && rhs->FamilyName().IsNotEmpty())
    return false; // both lhs and rhs have non-empty family names.

  // Testing PostScript, and LOGFONT names handles cases where the family name is missing.
  const bool rc
    = Internal_EqualName(lhs->m_en_postscript_name, rhs->m_en_postscript_name)
    || Internal_EqualName(lhs->m_en_windows_logfont_name, rhs->m_en_windows_logfont_name)
    || Internal_EqualName(lhs->PostScriptName(ON_Font::NameLocale::LocalizedFirst),rhs->PostScriptName(ON_Font::NameLocale::LocalizedFirst))
    || Internal_EqualName(lhs->WindowsLogfontName(ON_Font::NameLocale::LocalizedFirst),rhs->WindowsLogfontName(ON_Font::NameLocale::LocalizedFirst))
    ;
  return rc;
}